

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_compressed.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  char *pcVar11;
  char *format;
  char *pcVar12;
  bool bVar13;
  long lVar14;
  double dVar15;
  BITMAP_TYPE bitmaps [4];
  ALLEGRO_EVENT event;
  uint local_164;
  double local_160;
  ulong local_158;
  float local_14c;
  long local_148;
  undefined8 local_140;
  undefined8 local_138 [24];
  int local_78 [8];
  int local_58;
  
  memcpy(local_138,&DAT_00104bd0,0xc0);
  if (argc < 2) {
    pcVar12 = "data/mysha.pcx";
  }
  else {
    pcVar12 = argv[1];
  }
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
LAB_001029b3:
    pcVar12 = "Could not init Allegro.\n";
  }
  else {
    if (2 < argc) {
      iVar2 = atoi(argv[2]);
      al_set_new_display_adapter(iVar2);
    }
    al_init_image_addon();
    al_init_font_addon();
    al_install_keyboard();
    uVar5 = al_create_display(0x280,0x1e0);
    if (uVar5 == 0) {
      pcVar12 = "Error creating display\n";
    }
    else {
      lVar14 = 0x28;
      local_158 = uVar5;
      do {
        uVar3 = *(undefined4 *)((long)local_138 + lVar14 + -8);
        al_set_new_bitmap_format(uVar3);
        local_160 = (double)al_get_time();
        lVar6 = al_load_bitmap(pcVar12);
        *(long *)((long)&local_160 + lVar14) = lVar6;
        dVar15 = (double)al_get_time();
        if (lVar6 == 0) {
          format = "%s not found or failed to load\n";
          pcVar11 = pcVar12;
LAB_001029ac:
          abort_example(format,pcVar11);
          goto LAB_001029b3;
        }
        pcVar11 = *(char **)((long)local_138 + lVar14);
        log_printf("%s load time: %f sec\n",dVar15 - local_160,pcVar11);
        local_160 = (double)al_get_time();
        lVar7 = al_clone_bitmap(lVar6);
        *(long *)((long)&local_158 + lVar14) = lVar7;
        dVar15 = (double)al_get_time();
        if (lVar7 == 0) {
LAB_0010298d:
          format = "Couldn\'t clone %s\n";
          goto LAB_001029ac;
        }
        log_printf("%s clone time: %f sec\n",dVar15 - local_160,pcVar11);
        al_set_new_bitmap_format(0);
        local_160 = (double)al_get_time();
        lVar7 = al_clone_bitmap(lVar6);
        *(long *)(&stack0xfffffffffffffeb0 + lVar14) = lVar7;
        dVar15 = (double)al_get_time();
        if (lVar7 == 0) {
          format = "Couldn\'t decompress %s\n";
          goto LAB_001029ac;
        }
        log_printf("%s decompress time: %f sec\n",dVar15 - local_160,pcVar11);
        al_set_new_bitmap_format(uVar3);
        lVar7 = al_clone_bitmap(lVar6);
        *(long *)((long)&local_148 + lVar14) = lVar7;
        if (lVar7 == 0) goto LAB_0010298d;
        iVar2 = al_get_bitmap_width(lVar6);
        if ((0x80 < iVar2) && (iVar2 = al_get_bitmap_height(lVar6), 0x80 < iVar2)) {
          uVar3 = al_get_bitmap_format(lVar6);
          iVar2 = al_get_pixel_block_width(uVar3);
          iVar4 = al_get_pixel_block_height(uVar3);
          al_lock_bitmap_region_blocked
                    (lVar7,0x10 / (long)iVar2 & 0xffffffff,0x10 / (long)iVar4 & 0xffffffff,
                     0x40 / (long)iVar2 & 0xffffffff,0x40 / (long)iVar4 & 0xffffffff,0);
          al_unlock_bitmap(lVar7);
        }
        lVar14 = lVar14 + 0x30;
      } while (lVar14 != 0xe8);
      local_148 = al_load_bitmap("data/bkg.png");
      if (local_148 != 0) {
        local_160 = (double)((ulong)local_160 & 0xffffffff00000000);
        al_set_new_bitmap_format(0);
        local_140 = al_create_builtin_font();
        uVar8 = al_create_timer(0x3fa1111111111111);
        uVar9 = al_create_event_queue();
        uVar10 = al_get_display_event_source(local_158);
        al_register_event_source(uVar9,uVar10);
        uVar10 = al_get_keyboard_event_source();
        al_register_event_source(uVar9,uVar10);
        uVar10 = al_get_timer_event_source(uVar8);
        al_register_event_source(uVar9,uVar10);
        al_start_timer(uVar8);
        bVar13 = true;
        local_164 = 0;
LAB_0010278e:
        do {
          al_wait_for_event(uVar9,local_78);
          if (local_78[0] < 0x1e) {
            if (local_78[0] == 10) {
              if (local_58 < 0x52) {
                if (local_58 == 0x4b) {
                  local_160 = (double)CONCAT44(local_160._4_4_,1);
                }
                else if (local_58 == 0x3b) goto LAB_00102956;
              }
              else {
                if (local_58 == 0x53) {
                  local_164 = local_164 + 1;
                }
                else {
                  if (local_58 != 0x52) goto LAB_00102811;
                  local_164 = local_164 - 1;
                }
                local_164 = local_164 & 3;
              }
            }
            else if (local_78[0] == 0xc) {
              local_160 = (double)CONCAT44(local_160._4_4_,
                                           CONCAT31((int3)((ulong)local_160 >> 8),
                                                    SUB81(local_160,0) & local_58 != 0x4b));
            }
LAB_00102811:
            if (!bVar13) {
              bVar13 = false;
              goto LAB_0010278e;
            }
          }
          else if (local_78[0] != 0x1e) {
            if (local_78[0] != 0x2a) goto LAB_00102811;
LAB_00102956:
            al_destroy_bitmap(local_148);
            lVar14 = 0;
            do {
              al_destroy_bitmap(*(undefined8 *)((long)local_138 + lVar14));
              lVar14 = lVar14 + 0x30;
            } while (lVar14 != 0xc0);
            return 0;
          }
          cVar1 = al_is_event_queue_empty(uVar9);
          bVar13 = true;
          if (cVar1 != '\0') {
            uVar8 = local_138[(ulong)local_164 * 6];
            iVar2 = al_get_bitmap_width(uVar8);
            iVar4 = al_get_bitmap_height(uVar8);
            al_map_rgb_f(0,0,0);
            al_clear_to_color();
            bVar13 = false;
            al_draw_bitmap(0,0,local_148,0);
            al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
            uVar5 = 0;
            if (((ulong)local_160 & 1) == 0) {
              uVar5 = (ulong)local_164;
            }
            al_draw_textf(local_140,0,"SPACE to compare. Arrows to switch. Format: %s",
                          local_138[uVar5 * 6 + 5]);
            al_draw_bitmap(0,0x41a00000,local_138[uVar5 * 6],0);
            local_158 = CONCAT44(local_158._4_4_,(float)iVar2);
            al_draw_bitmap((float)iVar2,0x41a00000,local_138[uVar5 * 6 + 1],0);
            local_14c = (float)(iVar4 + 0x14);
            al_draw_bitmap(0,local_138[uVar5 * 6 + 2],0);
            al_draw_bitmap(local_158 & 0xffffffff,local_138[uVar5 * 6 + 3],0);
            al_flip_display();
          }
        } while( true );
      }
      pcVar12 = "data/bkg.png not found or failed to load\n";
      local_148 = 0;
    }
  }
  abort_example(pcVar12);
  iVar2 = __cxa_atexit();
  return iVar2;
}

Assistant:

int main(int argc, char **argv)
{
   const char *filename;
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_FONT *font;
   ALLEGRO_BITMAP *bkg;
   bool redraw = true;
   int ii;
   int cur_bitmap = 0;
   bool compare = false;
   #define NUM_BITMAPS 4
   BITMAP_TYPE bitmaps[NUM_BITMAPS] = {
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_ANY,       "Uncompressed"},
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_COMPRESSED_RGBA_DXT1, "DXT1"},
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_COMPRESSED_RGBA_DXT3, "DXT3"},
      {NULL, NULL, NULL, NULL, ALLEGRO_PIXEL_FORMAT_COMPRESSED_RGBA_DXT5, "DXT5"},
   };

   if (argc > 1) {
      filename = argv[1];
   }
   else {
      filename = "data/mysha.pcx";
   }

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   open_log();

   if (argc > 2) {
      al_set_new_display_adapter(atoi(argv[2]));
   }

   al_init_image_addon();
   al_init_font_addon();
   al_install_keyboard();

   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Error creating display\n");
   }

   for (ii = 0; ii < NUM_BITMAPS; ii++) {
      double t0, t1;
      al_set_new_bitmap_format(bitmaps[ii].format);

      /* Load */
      t0 = al_get_time();
      bitmaps[ii].bmp = al_load_bitmap(filename);
      t1 = al_get_time();

      if (!bitmaps[ii].bmp) {
         abort_example("%s not found or failed to load\n", filename);
      }
      log_printf("%s load time: %f sec\n", bitmaps[ii].name, t1 - t0);

      /* Clone */
      t0 = al_get_time();
      bitmaps[ii].clone = al_clone_bitmap(bitmaps[ii].bmp);
      t1 = al_get_time();

      if (!bitmaps[ii].clone) {
         abort_example("Couldn't clone %s\n", bitmaps[ii].name);
      }
      log_printf("%s clone time: %f sec\n", bitmaps[ii].name, t1 - t0);

      /* Decompress */
      al_set_new_bitmap_format(ALLEGRO_PIXEL_FORMAT_ANY);
      t0 = al_get_time();
      bitmaps[ii].decomp = al_clone_bitmap(bitmaps[ii].bmp);
      t1 = al_get_time();

      if (!bitmaps[ii].decomp) {
         abort_example("Couldn't decompress %s\n", bitmaps[ii].name);
      }
      log_printf("%s decompress time: %f sec\n", bitmaps[ii].name, t1 - t0);

      /* RW lock */
      al_set_new_bitmap_format(bitmaps[ii].format);
      bitmaps[ii].lock_clone = al_clone_bitmap(bitmaps[ii].bmp);

      if (!bitmaps[ii].lock_clone) {
         abort_example("Couldn't clone %s\n", bitmaps[ii].name);
      }

      if (al_get_bitmap_width(bitmaps[ii].bmp) > 128
            && al_get_bitmap_height(bitmaps[ii].bmp) > 128) {
         int bitmap_format = al_get_bitmap_format(bitmaps[ii].bmp);
         int block_width = al_get_pixel_block_width(bitmap_format);
         int block_height = al_get_pixel_block_height(bitmap_format);

         /* Lock and unlock it, hopefully causing a no-op operation */
         al_lock_bitmap_region_blocked(bitmaps[ii].lock_clone,
            16 / block_width, 16 / block_height, 64 / block_width,
            64 / block_height, ALLEGRO_LOCK_READWRITE);

         al_unlock_bitmap(bitmaps[ii].lock_clone);
      }
   }

   bkg = al_load_bitmap("data/bkg.png");
   if (!bkg) {
      abort_example("data/bkg.png not found or failed to load\n");
   }

   al_set_new_bitmap_format(ALLEGRO_PIXEL_FORMAT_ANY);
   font = al_create_builtin_font();
   timer = al_create_timer(1.0 / 30);
   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_timer_event_source(timer));
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      switch (event.type) {
         case ALLEGRO_EVENT_DISPLAY_CLOSE:
            goto EXIT;
         case ALLEGRO_EVENT_TIMER:
            redraw = true;
            break;
         case ALLEGRO_EVENT_KEY_DOWN:
            switch (event.keyboard.keycode) {
               case ALLEGRO_KEY_LEFT:
                  cur_bitmap = (cur_bitmap - 1 + NUM_BITMAPS) % NUM_BITMAPS;
                  break;
               case ALLEGRO_KEY_RIGHT:
                  cur_bitmap = (cur_bitmap + 1) % NUM_BITMAPS;
                  break;
               case ALLEGRO_KEY_SPACE:
                  compare = true;
                  break;
               case ALLEGRO_KEY_ESCAPE:
                  goto EXIT;
            }
            break;
         case ALLEGRO_EVENT_KEY_UP:
            if (event.keyboard.keycode == ALLEGRO_KEY_SPACE) {
               compare = false;
            }
            break;
      }
      if (redraw && al_is_event_queue_empty(queue)) {
         int w = al_get_bitmap_width(bitmaps[cur_bitmap].bmp);
         int h = al_get_bitmap_height(bitmaps[cur_bitmap].bmp);
         int idx = compare ? 0 : cur_bitmap;
         redraw = false;
         al_clear_to_color(al_map_rgb_f(0, 0, 0));
         al_draw_bitmap(bkg, 0, 0, 0);
         al_draw_textf(font, al_map_rgb_f(1, 1, 1), 5, 5, ALLEGRO_ALIGN_LEFT,
            "SPACE to compare. Arrows to switch. Format: %s", bitmaps[idx].name);
         al_draw_bitmap(bitmaps[idx].bmp, 0, 20, 0);
         al_draw_bitmap(bitmaps[idx].clone, w, 20, 0);
         al_draw_bitmap(bitmaps[idx].decomp, 0, 20 + h, 0);
         al_draw_bitmap(bitmaps[idx].lock_clone, w, 20 + h, 0);
         al_flip_display();
      }
   }
EXIT:

   al_destroy_bitmap(bkg);
   for (ii = 0; ii < NUM_BITMAPS; ii++) {
      al_destroy_bitmap(bitmaps[ii].bmp);
   }

   close_log(false);

   return 0;
}